

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::peer_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_error_alert *this)

{
  error_category *peVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char buf [200];
  string local_158;
  string local_138;
  string local_118;
  char local_f8 [200];
  
  peer_alert::message_abi_cxx11_(&local_158,&this->super_peer_alert);
  uVar3 = (ulong)(byte)(this->super_peer_alert).field_0x9c;
  if (uVar3 < 0x2b) {
    pcVar4 = operation_name::names[uVar3];
  }
  else {
    pcVar4 = "unknown operation";
  }
  iVar2 = (**((this->error).cat_)->_vptr_error_category)();
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_138,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_118,&local_138);
  snprintf(local_f8,200,"%s peer error [%s] [%s]: %s",local_158._M_dataplus._M_p,pcVar4,
           CONCAT44(extraout_var,iVar2),local_118._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_f8,(allocator<char> *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_error_alert::message() const
	{
		char buf[200];
		std::snprintf(buf, sizeof(buf), "%s peer error [%s] [%s]: %s"
			, peer_alert::message().c_str()
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str());
		return buf;
	}